

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall
cmFindCommon::GetIgnoredPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ignore)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  size_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  pointer path;
  allocator local_51;
  string local_50;
  
  paVar1 = &local_50.field_2;
  pcVar3 = "CMAKE_SYSTEM_IGNORE_PATH";
  ppcVar4 = GetIgnoredPaths::paths;
  do {
    ppcVar4 = ppcVar4 + 1;
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_50,pcVar3,&local_51);
    pcVar3 = cmMakefile::GetDefinition(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      sVar2 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
      cmSystemTools::ExpandListArgument(&local_50,ignore,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = *ppcVar4;
  } while (pcVar3 != (char *)0x0);
  for (path = (ignore->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      path != (ignore->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
  }
  return;
}

Assistant:

void cmFindCommon::GetIgnoredPaths(std::vector<std::string>& ignore)
{
  // null-terminated list of paths.
  static const char *paths[] =
    { "CMAKE_SYSTEM_IGNORE_PATH", "CMAKE_IGNORE_PATH", 0 };

  // Construct the list of path roots with no trailing slashes.
  for(const char **pathName = paths; *pathName; ++pathName)
    {
    // Get the list of paths to ignore from the variable.
    const char* ignorePath = this->Makefile->GetDefinition(*pathName);
    if((ignorePath == 0) || (strlen(ignorePath) == 0))
      {
      continue;
      }

    cmSystemTools::ExpandListArgument(ignorePath, ignore);
    }

  for(std::vector<std::string>::iterator i = ignore.begin();
      i != ignore.end(); ++i)
    {
    cmSystemTools::ConvertToUnixSlashes(*i);
    }
}